

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O2

Nonnull<const_char_*>
absl::lts_20250127::log_internal::
MakeCheckOpString<std::__cxx11::string_const&,std::__cxx11::string_const&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2,
          Nonnull<const_char_*> exprtext)

{
  Nonnull<const_char_*> pcVar1;
  CheckOpMessageBuilder comb;
  CheckOpMessageBuilder local_190;
  
  CheckOpMessageBuilder::CheckOpMessageBuilder(&local_190,exprtext);
  std::operator<<((ostream *)&local_190,(string *)v1);
  CheckOpMessageBuilder::ForVar2(&local_190);
  std::operator<<((ostream *)&local_190,(string *)v2);
  pcVar1 = CheckOpMessageBuilder::NewString(&local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> MakeCheckOpString(
    T1 v1, T2 v2, absl::Nonnull<const char*> exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}